

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  long *plVar1;
  pointer *pppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator __position;
  cmGlobalGenerator *pcVar4;
  cmGeneratorTarget *this_00;
  cmake *pcVar5;
  string *psVar6;
  byte bVar7;
  TargetType TVar8;
  int iVar9;
  PolicyStatus PVar10;
  undefined8 *puVar11;
  string *psVar12;
  ostream *poVar13;
  ulong uVar14;
  undefined7 extraout_var;
  string *c;
  pointer name;
  undefined4 uVar15;
  undefined8 unaff_RBP;
  ulong uVar16;
  pointer ppcVar18;
  bool bVar19;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar20;
  string expectedTargets;
  cmGeneratorTarget *te;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  ostringstream e;
  string local_290;
  ulong local_270;
  ostream *local_268;
  cmGeneratorTarget *local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  pointer local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *local_1e8;
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  string *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8 [2];
  ios_base local_138 [264];
  undefined8 uVar17;
  
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_allocated_capacity =
       local_258.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_268 = os;
  GetTargets(this,&local_1c8);
  local_1d0 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar19 = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar16 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar19);
  if (bVar19) {
    uVar14 = 0;
  }
  else {
    local_230 = (pointer)CONCAT71(local_230._1_7_,bVar19);
    local_1d8 = &(this->super_cmExportFileGenerator).Namespace;
    local_1e0 = (_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 *)&(this->super_cmExportFileGenerator).ExportedTargets;
    local_1e8 = (vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&this->Exports;
    local_270 = 0;
    name = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_260 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,name);
      std::operator+(&local_228,&local_258,local_1d8);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_208,local_260);
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        uVar17 = local_228.field_2._M_allocated_capacity;
      }
      uVar16 = (long)(_func_int ***)local_208._M_string_length + local_228._M_string_length;
      if ((ulong)uVar17 < uVar16) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          uVar17 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < uVar16) goto LAB_003602d6;
        puVar11 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_208,0,(char *)0x0,(ulong)local_228._M_dataplus._M_p);
      }
      else {
LAB_003602d6:
        puVar11 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_228,(ulong)local_208._M_dataplus._M_p);
      }
      local_1a8[0]._M_impl._0_8_ = &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
      plVar1 = puVar11 + 2;
      if ((_Base_ptr *)*puVar11 == (_Base_ptr *)plVar1) {
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar1;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)puVar11[3];
      }
      else {
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar1;
        local_1a8[0]._M_impl._0_8_ = (_Base_ptr *)*puVar11;
      }
      local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar11[1];
      *puVar11 = plVar1;
      puVar11[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::_M_append((char *)&local_290,local_1a8[0]._M_impl._0_8_);
      if ((_Base_ptr *)local_1a8[0]._M_impl._0_8_ !=
          &local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_1a8[0]._M_impl._0_8_,
                        (ulong)((long)&(local_1a8[0]._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_258,0,(char *)local_258._M_string_length,0x5c2669);
      pVar20 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>(local_1e0,&local_260);
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given target \"",0xe);
        psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(local_260);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar12->_M_dataplus)._M_p,
                             psVar12->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" more than once.",0x11);
        pcVar5 = this->LG->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmMakefile::GetBacktrace(this->LG->Makefile);
        cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_228,(cmListFileBacktrace *)&local_208);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else {
        __position._M_current =
             (this->Exports).
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Exports).
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
          _M_realloc_insert<cmGeneratorTarget*const&>(local_1e8,__position,&local_260);
        }
        else {
          *__position._M_current = local_260;
          pppcVar2 = &(this->Exports).
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppcVar2 = *pppcVar2 + 1;
        }
        TVar8 = cmGeneratorTarget::GetType(local_260);
        if (TVar8 == OBJECT_LIBRARY) {
          pcVar4 = this->LG->GlobalGenerator;
          iVar9 = (*pcVar4->_vptr_cmGlobalGenerator[0x25])(pcVar4,0);
          bVar7 = (byte)iVar9 ^ 1;
          TVar8 = (uint)bVar7 + (uint)bVar7 * 2 + OBJECT_LIBRARY;
        }
        local_270 = CONCAT71((int7)(local_270 >> 8),(byte)local_270 | TVar8 == INTERFACE_LIBRARY);
      }
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
      name = name + 1;
      local_230 = (pointer)CONCAT71(local_230._1_7_,name == local_1d0);
    } while (name != local_1d0);
    uVar16 = CONCAT71((int7)((ulong)&local_228 >> 8),local_230._0_1_);
    uVar14 = local_270;
  }
  if ((uVar16 & 1) != 0) {
    if ((uVar14 & 1) != 0) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                (this,local_268,"3.0.0");
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])
              (this,local_268,&local_290);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                             local_290.field_2._M_local_buf[0]) + 1);
  }
  if ((uVar16 & 1) == 0) {
    bVar7 = 0;
  }
  else {
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    ppcVar18 = (this->Exports).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_230 = (this->Exports).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    uVar17 = CONCAT71((int7)(uVar16 >> 8),ppcVar18 == local_230);
    uVar15 = (undefined4)uVar17;
    if (ppcVar18 != local_230) {
      do {
        this_00 = *ppcVar18;
        TVar8 = cmGeneratorTarget::GetType(this_00);
        paVar3 = &local_290.field_2;
        if (TVar8 == OBJECT_LIBRARY) {
          pcVar4 = this->LG->GlobalGenerator;
          (*pcVar4->_vptr_cmGlobalGenerator[0x25])(pcVar4,0);
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                  (this,local_268,this_00);
        cmTarget::AppendBuildInterfaceIncludes(this_00->Target);
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_1a8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1a8[0]._M_impl.super__Rb_tree_header._M_header;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_290._M_dataplus._M_p = (pointer)paVar3;
        local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1a8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"INTERFACE_SOURCES","")
        ;
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_LINK_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_LINK_DEPENDS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_290,this_00,
                   (ImportPropertyMap *)local_1a8);
        local_270 = CONCAT44(local_270._4_4_,(int)uVar17);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != paVar3) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        local_290._M_string_length = 0;
        local_290.field_2._M_local_buf[0] = '\0';
        local_290._M_dataplus._M_p = (pointer)paVar3;
        bVar19 = cmExportFileGenerator::PopulateExportProperties
                           (&this->super_cmExportFileGenerator,this_00,
                            (ImportPropertyMap *)local_1a8,&local_290);
        uVar16 = CONCAT71(extraout_var,bVar19) & 0xffffffff;
        if (bVar19) {
          PVar10 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
          if (PVar10 != WARN) {
            PVar10 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
            if (PVar10 != OLD) {
              cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                        (&this->super_cmExportFileGenerator,this_00,BuildInterface,
                         (ImportPropertyMap *)local_1a8,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_258);
            }
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,this_00,local_268,local_1a8);
        }
        else {
          pcVar5 = this->LG->GlobalGenerator->CMakeInstance;
          cmMakefile::GetBacktrace(this->LG->Makefile);
          cmake::IssueMessage(pcVar5,FATAL_ERROR,&local_290,(cmListFileBacktrace *)&local_228);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,
                          CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                   local_290.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(local_1a8);
        if ((char)uVar16 == '\0') goto LAB_00360b79;
        ppcVar18 = ppcVar18 + 1;
        uVar17 = CONCAT71((int7)(uVar16 >> 8),ppcVar18 == local_230);
        uVar15 = (undefined4)uVar17;
      } while (ppcVar18 != local_230);
    }
    psVar12 = (this->super_cmExportFileGenerator).Configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar6 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar12 != psVar6) {
      do {
        cmExportFileGenerator::GenerateImportConfig
                  (&this->super_cmExportFileGenerator,local_268,psVar12,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_258);
        psVar12 = psVar12 + 1;
      } while (psVar12 != psVar6);
    }
    local_270 = CONCAT44(local_270._4_4_,uVar15);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
              (this,local_268,&local_258);
LAB_00360b79:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_258);
    bVar7 = (byte)local_270;
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    bool generatedInterfaceRequired = false;
    this->GetTargets(targets);
    for (std::string const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      generatedInterfaceRequired |=
        this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY;
    }

    if (generatedInterfaceRequired) {
      this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  std::vector<std::string> missingTargets;

  // Create all the imported targets.
  for (cmGeneratorTarget* gte : this->Exports) {
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties,
        missingTargets);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c, missingTargets);
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return true;
}